

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BoyerMooreFind.h
# Opt level: O0

size_t __thiscall
axl::sl::
BoyerMooreFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8Decoder,_false,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
::findImpl<axl::sl::BoyerMooreTextAccessor>
          (BoyerMooreFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8Decoder,_false,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
           *this,BoyerMooreTextAccessor *accessor,size_t i0,size_t length)

{
  wchar_t wVar1;
  size_t sVar2;
  wchar_t *pwVar3;
  size_t sVar4;
  ulong in_RCX;
  long in_RDX;
  ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_> *in_RDI;
  C c;
  intptr_t j;
  size_t i;
  size_t last;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb8;
  wchar_t in_stack_ffffffffffffffbc;
  BoyerMooreSkipTablesBase<wchar_t> *this_00;
  BoyerMooreSkipTablesBase<wchar_t> *this_01;
  
  sVar2 = ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>::getCount(in_RDI);
  sVar4 = (long)&(((BoyerMooreSkipTablesBase<wchar_t> *)(sVar2 - 1))->m_badSkipTable).
                 super_BoyerMooreSkipTableRoot.m_table.
                 super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>.m_p + in_RDX;
  this_00 = (BoyerMooreSkipTablesBase<wchar_t> *)(sVar2 - 1);
  do {
    this_01 = this_00;
    if (in_RCX <= sVar4) {
      return sVar4 - (long)this_00;
    }
    while( true ) {
      wVar1 = BoyerMooreIncrementalAccessorBase<wchar_t,_false,_axl::sl::BoyerMooreTextState>::
              operator[]((BoyerMooreIncrementalAccessorBase<wchar_t,_false,_axl::sl::BoyerMooreTextState>
                          *)this_00,CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      in_stack_ffffffffffffffbc = wVar1;
      pwVar3 = Array<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>::operator[]
                         ((Array<wchar_t,_axl::sl::ArrayDetails<wchar_t>_> *)in_RDI,
                          CONCAT44(wVar1,in_stack_ffffffffffffffa8));
      if (wVar1 != *pwVar3) break;
      if (this_00 == (BoyerMooreSkipTablesBase<wchar_t> *)0x0) {
        return sVar4;
      }
      sVar4 = sVar4 - 1;
      this_00 = (BoyerMooreSkipTablesBase<wchar_t> *)
                ((long)&this_00[-1].m_goodSkipTable.super_BoyerMooreSkipTableRoot.m_table.
                        super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>.m_count
                + 7);
    }
    sVar2 = BoyerMooreSkipTablesBase<wchar_t>::getSkip
                      (this_01,(wchar_t)(sVar4 >> 0x20),(size_t)this_00);
    sVar4 = sVar2 + sVar4;
    this_00 = this_01;
  } while( true );
}

Assistant:

size_t
	findImpl(
		const Accessor& accessor,
		size_t i0,
		size_t length
	) const {
		size_t last = m_pattern.getCount() - 1;
		size_t i = i0 + last;
		while (i < length) {
			intptr_t j = last;
			C c;
			for (;;) {
				c = accessor[i];
				if (c != m_pattern[j])
					break;

				if (j == 0)
					return i;

				i--;
				j--;
			}

			i += m_skipTables.getSkip(c, j);
		}

		return i - last; // prospective start of match
	}